

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_20c1::DataDump<long_double>::~DataDump(DataDump<long_double> *this)

{
  pointer pcVar1;
  
  (this->super_DataDumpInterface)._vptr_DataDumpInterface = (_func_int **)&PTR__DataDump_00112cb8;
  pcVar1 = (this->print_format_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->print_format_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

~DataDump() override {
  }